

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void bothImplyNotNullRow(Walker *pWalker,Expr *pE1,Expr *pE2)

{
  if ((pE1 != (Expr *)0x0) && (pWalker->eCode == 0)) {
    sqlite3WalkExprNN(pWalker,pE1);
    if ((pWalker->eCode != 0) && (pWalker->eCode = 0, pE2 != (Expr *)0x0)) {
      sqlite3WalkExprNN(pWalker,pE2);
      return;
    }
  }
  return;
}

Assistant:

static void bothImplyNotNullRow(Walker *pWalker, Expr *pE1, Expr *pE2){
  if( pWalker->eCode==0 ){
    sqlite3WalkExpr(pWalker, pE1);
    if( pWalker->eCode ){
      pWalker->eCode = 0;
      sqlite3WalkExpr(pWalker, pE2);
    }
  }
}